

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O1

Am_Value_List * Class_Create_List(Am_Value_List *names)

{
  char cVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_String local_30;
  Am_String local_28;
  
  Am_Value_List::Am_Value_List(names);
  Am_Value_List::Start();
  while( true ) {
    cVar1 = Am_Value_List::Last();
    if (cVar1 != '\0') break;
    pAVar2 = (Am_Value *)Am_Value_List::Get();
    Am_String::Am_String(&local_30,pAVar2);
    Class_Create(&local_28);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&local_28);
    Am_Value_List::Add((Am_Wrapper *)names,(Am_Add_Position)pAVar3,true);
    Am_Object::~Am_Object((Am_Object *)&local_28);
    Am_String::~Am_String(&local_30);
    Am_Value_List::Next();
  }
  return names;
}

Assistant:

Am_Value_List
Class_Create_List(Am_Value_List names)
{
  Am_Value_List classes;

  for (names.Start(); !names.Last(); names.Next())
    classes.Add(Class_Create(names.Get()));
  return classes;
}